

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.cpp
# Opt level: O3

ssize_t __thiscall AutoFile::write(AutoFile *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  pointer pbVar2;
  void *pvVar3;
  char *pcVar4;
  ulong uVar5;
  undefined4 in_register_00000034;
  ulong uVar6;
  ptrdiff_t _Num;
  void *__n_00;
  void *pvVar7;
  long in_FS_OFFSET;
  array<std::byte,_4096UL> buf;
  
  pvVar7 = (void *)CONCAT44(in_register_00000034,__fd);
  buf._M_elems[8] = 0;
  buf._M_elems[9] = 0;
  buf._M_elems[10] = 0;
  buf._M_elems[0xb] = 0;
  buf._M_elems[0xc] = 0;
  buf._M_elems[0xd] = 0;
  buf._M_elems[0xe] = 0;
  buf._M_elems[0xf] = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((FILE *)this->m_file == (FILE *)0x0) {
    pcVar4 = (char *)__cxa_allocate_exception(0x20);
    buf._M_elems._8_8_ = std::iostream_category();
    buf._M_elems[0] = 1;
    buf._M_elems[1] = 0;
    buf._M_elems[2] = 0;
    buf._M_elems[3] = 0;
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar4,(error_code *)"AutoFile::write: file handle is nullptr");
LAB_0074f274:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  else {
    if ((this->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pvVar7 = (void *)fwrite(pvVar7,1,(size_t)__buf,(FILE *)this->m_file);
      if (pvVar7 != __buf) {
        pcVar4 = (char *)__cxa_allocate_exception(0x20);
        buf._M_elems._8_8_ = std::iostream_category();
        buf._M_elems[0] = 1;
        buf._M_elems[1] = 0;
        buf._M_elems[2] = 0;
        buf._M_elems[3] = 0;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar4,(error_code *)"AutoFile::write: write failed");
        goto LAB_0074f274;
      }
      if ((this->m_position).super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_engaged == true) {
        (this->m_position).super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_payload._M_value =
             (this->m_position).super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload._M_value + (long)__buf;
      }
    }
    else {
      if ((this->m_position).super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_engaged == false) {
        pcVar4 = (char *)__cxa_allocate_exception(0x20);
        buf._M_elems._8_8_ = std::iostream_category();
        buf._M_elems[0] = 1;
        buf._M_elems[1] = 0;
        buf._M_elems[2] = 0;
        buf._M_elems[3] = 0;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar4,(error_code *)"AutoFile::write: position unknown");
        goto LAB_0074f274;
      }
      if (__buf != (void *)0x0) {
        do {
          __n_00 = (void *)0x1000;
          if (__buf < (void *)0x1000) {
            __n_00 = __buf;
          }
          memcpy(&buf,pvVar7,(size_t)__n_00);
          pbVar2 = (this->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar6 = (long)(this->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
          if (uVar6 != 0) {
            uVar5 = (ulong)(this->m_position).super__Optional_base<long,_true,_true>._M_payload.
                           super__Optional_payload_base<long>._M_payload._M_value % uVar6;
            pvVar3 = (void *)0x0;
            do {
              buf._M_elems[(long)pvVar3] = buf._M_elems[(long)pvVar3] ^ pbVar2[uVar5];
              uVar5 = uVar5 + 1;
              if (uVar5 == uVar6) {
                uVar5 = 0;
              }
              pvVar3 = (void *)((long)pvVar3 + 1);
            } while (__n_00 != pvVar3);
          }
          pvVar3 = (void *)fwrite(&buf,1,(size_t)__n_00,(FILE *)this->m_file);
          if (pvVar3 != __n_00) {
            pcVar4 = (char *)__cxa_allocate_exception(0x20);
            std::iostream_category();
            std::ios_base::failure[abi:cxx11]::failure
                      (pcVar4,(error_code *)"XorFile::write: failed");
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
              __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
            goto LAB_0074f2e2;
          }
          pvVar7 = (void *)((long)pvVar7 + (long)__n_00);
          (this->m_position).super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value =
               (this->m_position).super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_payload._M_value + (long)__n_00;
          __buf = (void *)((long)__buf - (long)__n_00);
        } while (__buf != (void *)0x0);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return *(long *)(in_FS_OFFSET + 0x28);
    }
  }
LAB_0074f2e2:
  __stack_chk_fail();
}

Assistant:

void AutoFile::write(Span<const std::byte> src)
{
    if (!m_file) throw std::ios_base::failure("AutoFile::write: file handle is nullptr");
    if (m_xor.empty()) {
        if (std::fwrite(src.data(), 1, src.size(), m_file) != src.size()) {
            throw std::ios_base::failure("AutoFile::write: write failed");
        }
        if (m_position.has_value()) *m_position += src.size();
    } else {
        if (!m_position.has_value()) throw std::ios_base::failure("AutoFile::write: position unknown");
        std::array<std::byte, 4096> buf;
        while (src.size() > 0) {
            auto buf_now{Span{buf}.first(std::min<size_t>(src.size(), buf.size()))};
            std::copy(src.begin(), src.begin() + buf_now.size(), buf_now.begin());
            util::Xor(buf_now, m_xor, *m_position);
            if (std::fwrite(buf_now.data(), 1, buf_now.size(), m_file) != buf_now.size()) {
                throw std::ios_base::failure{"XorFile::write: failed"};
            }
            src = src.subspan(buf_now.size());
            *m_position += buf_now.size();
        }
    }
}